

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::LayeredTexture::LayeredTexture
          (LayeredTexture *this,uint64_t id,Element *element,Document *param_3,string *name)

{
  BlendMode BVar1;
  Scope *pSVar2;
  Element *pEVar3;
  Token *pTVar4;
  float fVar5;
  allocator local_a1;
  string local_a0;
  Element *local_80;
  Element *Alphas;
  string local_70;
  Element *local_50;
  Element *BlendModes;
  Scope *local_38;
  Scope *sc;
  string *name_local;
  Document *param_3_local;
  Element *element_local;
  uint64_t id_local;
  LayeredTexture *this_local;
  
  sc = (Scope *)name;
  name_local = (string *)param_3;
  param_3_local = (Document *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__LayeredTexture_0037b7c8;
  std::vector<const_Assimp::FBX::Texture_*,_std::allocator<const_Assimp::FBX::Texture_*>_>::vector
            (&this->textures);
  this->blendMode = BlendMode_Modulate;
  this->alpha = 1.0;
  pSVar2 = GetRequiredScope((Element *)param_3_local);
  local_38 = pSVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"BlendModes",(allocator *)((long)&Alphas + 7));
  pEVar3 = Scope::operator[](pSVar2,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Alphas + 7));
  pSVar2 = local_38;
  local_50 = pEVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"Alphas",&local_a1);
  pEVar3 = Scope::operator[](pSVar2,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_80 = pEVar3;
  if (local_50 != (Element *)0x0) {
    pTVar4 = GetRequiredToken(local_50,0);
    BVar1 = ParseTokenAsInt(pTVar4);
    this->blendMode = BVar1;
  }
  if (local_80 != (Element *)0x0) {
    pTVar4 = GetRequiredToken(local_80,0);
    fVar5 = ParseTokenAsFloat(pTVar4);
    this->alpha = fVar5;
  }
  return;
}

Assistant:

LayeredTexture::LayeredTexture(uint64_t id, const Element& element, const Document& /*doc*/, const std::string& name)
: Object(id,element,name)
,blendMode(BlendMode_Modulate)
,alpha(1)
{
    const Scope& sc = GetRequiredScope(element);

    const Element* const BlendModes = sc["BlendModes"];
    const Element* const Alphas = sc["Alphas"];


    if(BlendModes!=0)
    {
        blendMode = (BlendMode)ParseTokenAsInt(GetRequiredToken(*BlendModes,0));
    }
    if(Alphas!=0)
    {
        alpha = ParseTokenAsFloat(GetRequiredToken(*Alphas,0));
    }
}